

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O0

unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
 __thiscall ApplicationFactory::makeRenderer(ApplicationFactory *this,Context *context)

{
  unique_ptr<solitaire::graphics::SDLGraphicsSystem,_std::default_delete<solitaire::graphics::SDLGraphicsSystem>_>
  *in_RDX;
  string local_68;
  unique_ptr<solitaire::SDL::Wrapper,_std::default_delete<solitaire::SDL::Wrapper>_> local_38;
  undefined1 local_30 [24];
  Context *context_local;
  ApplicationFactory *this_local;
  
  context_local = context;
  this_local = this;
  std::make_unique<solitaire::SDL::Wrapper>();
  std::
  make_unique<solitaire::graphics::SDLGraphicsSystem,std::unique_ptr<solitaire::SDL::Wrapper,std::default_delete<solitaire::SDL::Wrapper>>>
            ((unique_ptr<solitaire::SDL::Wrapper,_std::default_delete<solitaire::SDL::Wrapper>_> *)
             local_30);
  findAssetsPath_abi_cxx11_(&local_68,(ApplicationFactory *)context);
  std::
  make_unique<solitaire::graphics::Renderer,solitaire::interfaces::Context_const&,std::unique_ptr<solitaire::graphics::SDLGraphicsSystem,std::default_delete<solitaire::graphics::SDLGraphicsSystem>>,std::__cxx11::string>
            ((Context *)(local_30 + 8),in_RDX,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::
  unique_ptr<solitaire::graphics::interfaces::Renderer,std::default_delete<solitaire::graphics::interfaces::Renderer>>
  ::
  unique_ptr<solitaire::graphics::Renderer,std::default_delete<solitaire::graphics::Renderer>,void>
            ((unique_ptr<solitaire::graphics::interfaces::Renderer,std::default_delete<solitaire::graphics::interfaces::Renderer>>
              *)this,(unique_ptr<solitaire::graphics::Renderer,_std::default_delete<solitaire::graphics::Renderer>_>
                      *)(local_30 + 8));
  std::
  unique_ptr<solitaire::graphics::Renderer,_std::default_delete<solitaire::graphics::Renderer>_>::
  ~unique_ptr((unique_ptr<solitaire::graphics::Renderer,_std::default_delete<solitaire::graphics::Renderer>_>
               *)(local_30 + 8));
  std::__cxx11::string::~string((string *)&local_68);
  std::
  unique_ptr<solitaire::graphics::SDLGraphicsSystem,_std::default_delete<solitaire::graphics::SDLGraphicsSystem>_>
  ::~unique_ptr((unique_ptr<solitaire::graphics::SDLGraphicsSystem,_std::default_delete<solitaire::graphics::SDLGraphicsSystem>_>
                 *)local_30);
  std::unique_ptr<solitaire::SDL::Wrapper,_std::default_delete<solitaire::SDL::Wrapper>_>::
  ~unique_ptr(&local_38);
  return (__uniq_ptr_data<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>,_true,_true>
          )(__uniq_ptr_data<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<graphics::interfaces::Renderer>
ApplicationFactory::makeRenderer(
    const solitaire::interfaces::Context& context) const
{
    return std::make_unique<Renderer>(
        context,
        std::make_unique<SDLGraphicsSystem>(
            std::make_unique<SDL::Wrapper>()
        ),
        findAssetsPath()
    );
}